

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

void add_erosion_words(obj *obj,char *prefix,boolean in_final_dump)

{
  short sVar1;
  undefined4 uVar2;
  boolean bVar3;
  ushort uVar4;
  uint uVar5;
  size_t sVar6;
  char *__s;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  
  sVar1 = obj->otyp;
  if ((((((*(ushort *)&objects[sVar1].field_0x11 & 0x1f0) == 0xb0) ||
        (bVar3 = is_flammable(obj), bVar3 != '\0')) || (bVar3 = is_rottable(obj), sVar1 == 0x1a)) ||
      ((bVar3 != '\0' ||
       (uVar4 = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f, uVar4 == 0xd)))) ||
     (uVar4 == 0xb)) {
    uVar5 = *(uint *)&obj->field_0x4a >> 8 & 3;
    if (uVar5 != 0 && sVar1 != 0x1a) {
      if (uVar5 == 3) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"thoroughly ",0xc);
      }
      else if (uVar5 == 2) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"very ",6);
      }
      pcVar8 = "burnt ";
      if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xb0) {
        pcVar8 = "rusty ";
      }
      sVar6 = strlen(prefix);
      uVar2 = *(undefined4 *)(pcVar8 + 3);
      *(undefined4 *)(prefix + sVar6) = *(undefined4 *)pcVar8;
      *(undefined4 *)(prefix + sVar6 + 3) = uVar2;
    }
    uVar5 = *(uint *)&obj->field_0x4a >> 10 & 3;
    if (uVar5 != 0 && sVar1 != 0x1a) {
      if (uVar5 == 3) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"thoroughly ",0xc);
      }
      else if (uVar5 == 2) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"very ",6);
      }
      pcVar8 = "rotted ";
      if (((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) - 0xb & 0xfffd) == 0) {
        pcVar8 = "corroded ";
      }
      strcat(prefix,pcVar8);
    }
    if (((*(uint *)&obj->field_0x4a >> 0xc & 1) != 0) &&
       (in_final_dump != '\0' || (char)*(uint *)&obj->field_0x4a < '\0')) {
      __s = eos(prefix);
      pcVar8 = "] [";
      pcVar9 = "";
      if ((obj->field_0x4a & 0x80) != 0) {
        pcVar8 = "\n\n";
      }
      if (sVar1 == 0x1a) {
        pcVar7 = "fixed";
      }
      else {
        uVar4 = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f;
        if (uVar4 == 0xb) {
          pcVar7 = "rustproof";
        }
        else if (uVar4 == 0xd) {
          pcVar7 = "corrodeproof";
        }
        else {
          bVar3 = is_flammable(obj);
          pcVar7 = "fireproof";
          if (bVar3 == '\0') {
            pcVar7 = "";
          }
        }
      }
      if (-1 < (char)obj->field_0x4a) {
        pcVar9 = "]";
      }
      sprintf(__s,"%s%s%s ",pcVar8 + 2,pcVar7,pcVar9);
      return;
    }
  }
  return;
}

Assistant:

static void add_erosion_words(const struct obj *obj, char *prefix,
			      boolean in_final_dump)
{
	boolean iscrys = (obj->otyp == CRYSKNIFE);


	if (!is_damageable(obj) && !iscrys) return;

	/* The only cases where any of these bits do double duty are for
	 * rotted food and diluted potions, which are all not is_damageable().
	 */
	if (obj->oeroded && !iscrys) {
		switch (obj->oeroded) {
			case 2:	strcat(prefix, "very "); break;
			case 3:	strcat(prefix, "thoroughly "); break;
		}			
		strcat(prefix, is_rustprone(obj) ? "rusty " : "burnt ");
	}
	if (obj->oeroded2 && !iscrys) {
		switch (obj->oeroded2) {
			case 2:	strcat(prefix, "very "); break;
			case 3:	strcat(prefix, "thoroughly "); break;
		}			
		strcat(prefix, is_corrodeable(obj) ? "corroded " :
			"rotted ");
	}
	if (obj->oerodeproof && (in_final_dump || obj->rknown))
		sprintf(eos(prefix), "%s%s%s ",
			obj->rknown ? "" : "[",
			iscrys ? "fixed" :
			is_rustprone(obj) ? "rustproof" :
			is_corrodeable(obj) ? "corrodeproof" :	/* "stainless"? */
			is_flammable(obj) ? "fireproof" : "",
			obj->rknown ? "" : "]");
}